

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::PrintStats(ScriptContext *this)

{
  uint *addr;
  uint uVar1;
  int iVar2;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar3;
  Type pcVar4;
  long *plVar5;
  BailoutStatsMap *pBVar6;
  Type pSVar7;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *pWVar8;
  ParseableFunctionInfo *pPVar9;
  RejitStats *pRVar10;
  Type piVar11;
  SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> *pSVar12;
  CacheDataMap *pCVar13;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
  *pSVar14;
  PolymorphicInlineCache *pPVar15;
  RegexStatsDatabase *this_00;
  code *pcVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [8];
  bool bVar25;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar26;
  undefined4 *puVar27;
  char *pcVar28;
  char16 *pcVar29;
  char16 *pcVar30;
  Type *pTVar31;
  DebugWriter *w;
  uint uVar32;
  long lVar33;
  long lVar34;
  RejitStatsMap *pRVar35;
  Phases *pPVar36;
  uint uVar37;
  int iVar38;
  ScriptContext *pSVar39;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar40;
  char16_t *pcVar41;
  FunctionBody *body;
  ulong uVar42;
  int j_1;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  int j;
  int iVar46;
  long lVar47;
  undefined1 auStack_728 [8];
  uint nativeCodeBuckets [15];
  undefined1 auStack_528 [8];
  uint totalBuckets [15];
  undefined1 auStack_328 [8];
  WCHAR buf_1 [256];
  uint rejits [15];
  uint usedNativeCodeBuckets [15];
  uint local_7c;
  uint local_78;
  uint loopJitCodeUsed;
  uint bucketSize1;
  uint bucketSize2;
  uint size1CutOffbucketId;
  uint zeroInterpretedFunctions;
  uint oneInterpretedFunctions;
  uint nonZeroBytecodeFunctions;
  Phases *local_58;
  double pct;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *local_48;
  RejitStatsMap *local_40;
  ScriptContext *local_38;
  
  if (DAT_015b0941 == '\x01') {
    ProfileTypes(this);
  }
  if (DAT_015b0943 == '\x01') {
    Output::Print(L"CodeSize: %6d\nBailOutRecord Size: %6d\nLocalOffsets Size: %6d\n",this->codeSize
                  ,this->bailOutRecordBytes);
  }
  if (DAT_015b0934 == '\x01') {
    ProfileObjectLiteral(this);
  }
  if (this->stringProfiler != (StringProfiler *)0x0) {
    StringProfiler::PrintAll(this->stringProfiler);
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::StringProfiler>
              (&this->miscAllocator,this->stringProfiler);
    this->stringProfiler = (StringProfiler *)0x0;
  }
  if ((this->profileMemoryDump == true) && (bVar25 = MemoryProfiler::IsTraceEnabled(false), bVar25))
  {
    MemoryProfiler::PrintAll();
    bVar25 = Phases::IsEnabled((Phases *)&DAT_015b95c0,AllPhase);
    if ((bVar25) || (bVar25 = Phases::IsEnabled((Phases *)&DAT_015b95c0,RunPhase), bVar25)) {
      Memory::Recycler::PrintAllocStats(this->recycler);
    }
  }
  bVar25 = Phases::IsEnabled((Phases *)&DAT_015b3868,ByteCodePhase);
  if (bVar25) {
    Output::Print(L" Total Bytecode size: <%d, %d, %d> = %d\n");
  }
  local_38 = this;
  if (DAT_015933a8 == '\x01') {
    lVar47 = 0;
    Output::Print(L"ByteCode Histogram\n");
    Output::Print(L"\n");
    uVar42 = 0;
    uVar37 = 0;
    do {
      uVar44 = (int)uVar42 + this->byteCodeHistogram[lVar47];
      uVar42 = (ulong)uVar44;
      uVar37 = (uVar37 + 1) - (uint)(this->byteCodeHistogram[lVar47] == 0);
      lVar47 = lVar47 + 1;
    } while (lVar47 != 0x189);
    Output::Print(L"%9u                     Total executed ops\n",uVar42);
    Output::Print(L"\n");
    _oneInterpretedFunctions = (RejitStatsMap *)(double)uVar44;
    uVar44 = 0xffffffff;
    local_40 = (RejitStatsMap *)0x0;
    while( true ) {
      uVar43 = 0;
      uVar42 = 0xffffffff;
      uVar45 = 0;
      do {
        bVar25 = OpCodeUtil::IsValidOpcode((OpCode)uVar43);
        pSVar39 = local_38;
        if ((bVar25) &&
           (uVar1 = local_38->byteCodeHistogram[uVar43], uVar45 < uVar1 && uVar1 < uVar44)) {
          uVar42 = uVar43 & 0xffffffff;
          uVar45 = uVar1;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != 0x189);
      if ((int)uVar42 == -1) break;
      uVar44 = local_38->byteCodeHistogram[(int)uVar42];
      local_58 = (Phases *)((double)uVar44 / (double)_oneInterpretedFunctions);
      pct = (double)local_58 * 100.0;
      uVar42 = 0;
      do {
        bVar25 = OpCodeUtil::IsValidOpcode((OpCode)uVar42);
        if ((bVar25) && (uVar44 == pSVar39->byteCodeHistogram[uVar42])) {
          local_40 = (RejitStatsMap *)((double)local_40 + (double)local_58);
          local_48 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                      *)((double)local_40 * 100.0);
          OpCodeUtil::GetOpCodeName((OpCode)uVar42);
          Output::Print(L"%9u  %5.1lf  %5.1lf  %04x %s\n",SUB84(pct,0),local_48,(ulong)uVar44,
                        uVar42 & 0xffff);
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 != 0x189);
    }
    Output::Print(L"\n");
    Output::Print(L"Unique opcodes: %d\n",(ulong)uVar37);
  }
  pSVar39 = local_38;
  bVar25 = Phases::IsEnabled((Phases *)&DAT_015b3868,BGJitPhase);
  uVar19._4_2_ = buf_1[0x1a];
  uVar19._6_2_ = buf_1[0x1b];
  uVar19._0_2_ = buf_1[0x18];
  uVar19._2_2_ = buf_1[0x19];
  uVar18._4_2_ = buf_1[0x16];
  uVar18._6_2_ = buf_1[0x17];
  uVar18._0_2_ = buf_1[0x14];
  uVar18._2_2_ = buf_1[0x15];
  uVar17._4_2_ = buf_1[0x12];
  uVar17._6_2_ = buf_1[0x13];
  uVar17._0_2_ = buf_1[0x10];
  uVar17._2_2_ = buf_1[0x11];
  pPVar36 = (Phases *)&DAT_015b3868;
  if (bVar25) {
    if (pSVar39->interpretedCount < 0x33) {
      bVar25 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ForceFlag);
      uVar19._4_2_ = buf_1[0x1a];
      uVar19._6_2_ = buf_1[0x1b];
      uVar19._0_2_ = buf_1[0x18];
      uVar19._2_2_ = buf_1[0x19];
      uVar18._4_2_ = buf_1[0x16];
      uVar18._6_2_ = buf_1[0x17];
      uVar18._0_2_ = buf_1[0x14];
      uVar18._2_2_ = buf_1[0x15];
      uVar17._4_2_ = buf_1[0x12];
      uVar17._6_2_ = buf_1[0x13];
      uVar17._0_2_ = buf_1[0x10];
      uVar17._2_2_ = buf_1[0x11];
      if (!bVar25) goto LAB_00787a42;
    }
    local_58 = (Phases *)&DAT_015b3868;
    local_7c = 0;
    local_78 = 0x14;
    loopJitCodeUsed = 100;
    bucketSize1 = 4;
    totalBuckets[10] = 0;
    totalBuckets[0xb] = 0;
    totalBuckets[0xc] = 0;
    totalBuckets[6] = 0;
    totalBuckets[7] = 0;
    totalBuckets[8] = 0;
    totalBuckets[9] = 0;
    totalBuckets[2] = 0;
    totalBuckets[3] = 0;
    totalBuckets[4] = 0;
    totalBuckets[5] = 0;
    auStack_528 = (undefined1  [8])0x0;
    totalBuckets[0] = 0;
    totalBuckets[1] = 0;
    nativeCodeBuckets[10] = 0;
    nativeCodeBuckets[0xb] = 0;
    nativeCodeBuckets[0xc] = 0;
    nativeCodeBuckets[6] = 0;
    nativeCodeBuckets[7] = 0;
    nativeCodeBuckets[8] = 0;
    nativeCodeBuckets[9] = 0;
    nativeCodeBuckets[2] = 0;
    nativeCodeBuckets[3] = 0;
    nativeCodeBuckets[4] = 0;
    nativeCodeBuckets[5] = 0;
    auStack_728 = (undefined1  [8])0x0;
    nativeCodeBuckets[0] = 0;
    nativeCodeBuckets[1] = 0;
    stack0xffffffffffffff18 = (SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> *)0x0;
    rejits[10] = 0;
    rejits[0xb] = 0;
    rejits[0xc] = 0;
    rejits[6] = 0;
    rejits[7] = 0;
    rejits[8] = 0;
    rejits[9] = 0;
    rejits[2] = 0;
    rejits[3] = 0;
    rejits[4] = 0;
    rejits[5] = 0;
    buf_1[0xfc] = L'\0';
    buf_1[0xfd] = L'\0';
    buf_1[0xfe] = L'\0';
    buf_1[0xff] = L'\0';
    rejits[0] = 0;
    rejits[1] = 0;
    bucketSize2 = 0;
    size1CutOffbucketId = 0;
    zeroInterpretedFunctions = 0;
    Output::Print(L"Script Context: 0x%p Url: %s\n",pSVar39,pSVar39->url);
    pct = (double)&pSVar39->sourceList;
    pLVar26 = Memory::
              RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
              ::operator->((RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                            *)pct);
    iVar38 = (pLVar26->
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
             ).count;
    if (0 < iVar38) {
      puVar27 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pRVar35 = (RejitStatsMap *)0x0;
      local_48 = pLVar26;
      do {
        pRVar3 = (pLVar26->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[(long)pRVar35].ptr;
        local_40 = pRVar35;
        if ((((((ulong)pRVar3 & 1) == 0 &&
               pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
             (pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef, pcVar4 != (Type)0x0)) &&
            (plVar5 = *(long **)(pcVar4 + 0x18), plVar5 != (long *)0x0)) &&
           (uVar37 = *(uint *)((long)plVar5 + 0x1c), uVar37 != 0)) {
          lVar47 = 0;
          uVar42 = 0;
          do {
            iVar38 = *(int *)(*plVar5 + uVar42 * 4);
            lVar34 = lVar47;
            if (iVar38 != -1) {
              do {
                lVar47 = (long)iVar38;
                iVar38 = *(int *)(plVar5[1] + 8 + lVar47 * 0x10);
                lVar47 = *(long *)(plVar5[1] + lVar47 * 0x10);
                if (lVar47 == 0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar27 = 1;
                  bVar25 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                               ,199,"(functionBody)","functionBody");
                  uVar22._4_2_ = buf_1[0x1a];
                  uVar22._6_2_ = buf_1[0x1b];
                  uVar22._0_2_ = buf_1[0x18];
                  uVar22._2_2_ = buf_1[0x19];
                  uVar21._4_2_ = buf_1[0x16];
                  uVar21._6_2_ = buf_1[0x17];
                  uVar21._0_2_ = buf_1[0x14];
                  uVar21._2_2_ = buf_1[0x15];
                  uVar20._4_2_ = buf_1[0x12];
                  uVar20._6_2_ = buf_1[0x13];
                  uVar20._0_2_ = buf_1[0x10];
                  uVar20._2_2_ = buf_1[0x11];
                  if (!bVar25) goto LAB_007887ab;
                  *puVar27 = 0;
                  lVar47 = lVar34;
                }
                lVar34 = lVar47;
              } while (iVar38 != -1);
              uVar37 = *(uint *)((long)plVar5 + 0x1c);
            }
            pSVar39 = local_38;
            uVar42 = uVar42 + 1;
          } while (uVar42 < uVar37);
          if (lVar47 != 0) {
            if (DAT_015bc46a == 1) {
              Output::TraceStats(BGJitPhase,L"Function list\n");
            }
            if ((DAT_015bc46a & 1) != 0) {
              Output::TraceStats(BGJitPhase,L"===============================\n");
            }
            if ((DAT_015bc46a & 1) != 0) {
              Output::TraceStats(BGJitPhase,L"%-24s, %-8s, %-10s, %-10s, %-10s, %-10s, %-10s\n",
                                 L"Function",L"InterpretedCount",L"ByteCodeInLoopSize",
                                 L"ByteCodeSize",L"IsJitted",L"IsUsed",L"NativeCodeSize");
            }
            if (*(long *)pct != 0) {
              pLVar26 = Memory::
                        RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                        ::operator->((RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                                      *)pct);
              iVar38 = (pLVar26->
                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                       ).count;
              if (0 < iVar38) {
                pRVar35 = (RejitStatsMap *)0x0;
                local_48 = pLVar26;
                do {
                  pRVar3 = (pLVar26->
                           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                           ).buffer.ptr[(long)pRVar35].ptr;
                  if (((((ulong)pRVar3 & 1) == 0 &&
                        pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
                      (pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef,
                      pcVar4 != (Type)0x0)) &&
                     (plVar5 = *(long **)(pcVar4 + 0x18), plVar5 != (long *)0x0)) {
                    auStack_328 = (undefined1  [8])&bucketSize2;
                    buf_1._0_8_ = &zeroInterpretedFunctions;
                    buf_1._8_8_ = &size1CutOffbucketId;
                    buf_1._16_8_ = &local_78;
                    buf_1._24_8_ = &bucketSize1;
                    buf_1._32_8_ = &loopJitCodeUsed;
                    buf_1._40_8_ = auStack_528;
                    buf_1._48_8_ = auStack_728;
                    buf_1._56_8_ = rejits + 0xe;
                    buf_1._64_8_ = buf_1 + 0xfc;
                    buf_1._72_8_ = &local_7c;
                    uVar37 = *(uint *)((long)plVar5 + 0x1c);
                    if (uVar37 != 0) {
                      uVar42 = 0;
                      local_40 = pRVar35;
                      do {
                        iVar38 = *(int *)(*plVar5 + uVar42 * 4);
                        if (iVar38 != -1) {
                          do {
                            lVar47 = (long)iVar38;
                            iVar38 = *(int *)(plVar5[1] + 8 + lVar47 * 0x10);
                            body = *(FunctionBody **)(plVar5[1] + lVar47 * 0x10);
                            if (body == (FunctionBody *)0x0) {
                              AssertCount = AssertCount + 1;
                              Throw::LogAssert();
                              *puVar27 = 1;
                              bVar25 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                  ,0xa2,"(functionBody)","functionBody");
                              uVar20 = buf_1._32_8_;
                              uVar21 = buf_1._40_8_;
                              uVar22 = buf_1._48_8_;
                              if (!bVar25) goto LAB_007887ab;
                              *puVar27 = 0;
                              body = (FunctionBody *)0x0;
                            }
                            anon_func::anon_class_88_1_3fcf6586::anon_class_88_1_3fcf6586_for_fn::
                            anon_class_88_1_60afaf7f_for_fn::anon_class_88_11_04ad8b93_for_mapper::
                            operator()((anon_class_88_11_04ad8b93_for_mapper *)auStack_328,body);
                          } while (iVar38 != -1);
                          uVar37 = *(uint *)((long)plVar5 + 0x1c);
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 < uVar37);
                      iVar38 = (local_48->
                               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                               ).count;
                      pLVar26 = local_48;
                      pRVar35 = local_40;
                      pSVar39 = local_38;
                    }
                  }
                  pRVar35 = (RejitStatsMap *)((long)&pRVar35->size + 1);
                } while ((long)pRVar35 < (long)iVar38);
              }
            }
            break;
          }
          iVar38 = (local_48->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).count;
          pLVar26 = local_48;
        }
        pRVar35 = (RejitStatsMap *)((long)&local_40->size + 1);
      } while ((long)pRVar35 < (long)iVar38);
    }
    Output::Print(L"**  SpeculativelyJitted: %6d FunctionsJitted: %6d JittedUsed: %6d Usage:%f ByteCodesJitted: %6d JitCodeUsed: %6d Usage: %f \n"
                  ,SUB84((double)(((float)pSVar39->funcJitCodeUsed / (float)pSVar39->funcJITCount) *
                                 100.0),0),
                  (double)(((float)pSVar39->jitCodeUsed / (float)pSVar39->bytecodeJITCount) * 100.0)
                  ,(ulong)pSVar39->speculativeJitCount);
    Output::Print(L"** LoopJITCount: %6d LoopJitCodeUsed: %6d Usage: %f\n",
                  SUB84((double)(((float)local_7c / (float)pSVar39->loopJITCount) * 100.0),0));
    Output::Print(L"** TotalInterpretedCalls: %6d MaxFuncInterp: %6d  InterpretedHighPri: %6d \n",
                  (ulong)pSVar39->interpretedCount,(ulong)pSVar39->maxFuncInterpret,
                  (ulong)pSVar39->interpretedCallsHighPri);
    Output::Print(L"** ZeroInterpretedFunctions: %6d OneInterpretedFunctions: %6d ZeroInterpretedWithNonZeroBytecode: %6d \n "
                  ,(ulong)bucketSize2,(ulong)size1CutOffbucketId,(ulong)zeroInterpretedFunctions);
    Output::Print(L"** %-24s : %-10s %-10s %-10s %-10s %-10s\n",L"InterpretedCounts",L"Total",
                  L"NativeCode",L"Used",L"Usage",L"Rejits");
    uVar43 = 0;
    uVar42 = 0;
    do {
      uVar32 = local_78;
      if ((uVar43 <= bucketSize1) || (uVar37 = 100000, uVar32 = loopJitCodeUsed, uVar43 != 0xe)) {
        uVar37 = uVar32 + (int)uVar42;
      }
      Output::Print(L"** %10d - %10d : %10d %10d %10d %7.2f %10d\n",
                    SUB84((double)(((float)rejits[uVar43 + 0xe] /
                                   (float)nativeCodeBuckets[uVar43 - 2]) * 100.0),0),uVar42,
                    (ulong)uVar37);
      uVar43 = uVar43 + 1;
      uVar42 = (ulong)uVar37;
    } while (uVar43 != 0xf);
    Output::Print(L"\n\n");
    pPVar36 = local_58;
    pSVar39 = local_38;
    uVar17 = buf_1._32_8_;
    uVar18 = buf_1._40_8_;
    uVar19 = buf_1._48_8_;
  }
LAB_00787a42:
  buf_1._32_8_ = uVar17;
  buf_1._40_8_ = uVar18;
  buf_1._48_8_ = uVar19;
  bVar25 = Phases::IsEnabled(pPVar36,ReJITPhase);
  if (bVar25) {
    Output::Print(L"%-40s %6s\n",L"Bailout Reason,",L"Count");
    pBVar6 = pSVar39->bailoutReasonCounts;
    uVar37 = pBVar6->bucketCount;
    uVar44 = 0;
    if (uVar37 != 0) {
      uVar44 = 0;
      pRVar35 = (RejitStatsMap *)0x0;
      do {
        iVar38 = pBVar6->buckets[(long)pRVar35];
        if (iVar38 != -1) {
          do {
            local_40 = pRVar35;
            pSVar7 = pBVar6->entries;
            uVar37 = pSVar7[iVar38].
                     super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                     super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                     .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value;
            iVar46 = pSVar7[iVar38].
                     super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                     super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                     .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
            if (uVar37 != 0) {
              pcVar28 = GetBailOutKindName(pSVar7[iVar38].
                                           super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                           .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                           super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                           .
                                           super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>
                                           .key);
              swprintf_s<256ul>((WCHAR (*) [256])auStack_328,L"%S,",pcVar28);
              Output::Print(L"%-40s %6d\n",(WCHAR (*) [256])auStack_328,(ulong)uVar37);
            }
            uVar44 = uVar44 + uVar37;
            iVar38 = iVar46;
            pRVar35 = local_40;
          } while (iVar46 != -1);
          uVar37 = pBVar6->bucketCount;
        }
        pRVar35 = (RejitStatsMap *)((long)&pRVar35->size + 1);
      } while (pRVar35 < (RejitStatsMap *)(ulong)uVar37);
    }
    Output::Print(L"%-40s %6d\n",L"TOTAL,",(ulong)uVar44);
    Output::Print(L"\n\n");
    Output::Print(L"%-40s %6s\n",L"Rejit Reason,",L"Count");
    pSVar39 = local_38;
    local_48 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                *)0x2d;
    pLVar26 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
               *)0x0;
    uVar37 = 0;
    do {
      uVar32 = pSVar39->rejitReasonCounts[(long)pLVar26];
      if (uVar32 != 0) {
        swprintf_s<256ul>((WCHAR (*) [256])auStack_728,L"%S,",RejitReasonNames[(long)pLVar26]);
        Output::Print(L"%-40s %6d\n",(WCHAR (*) [256])auStack_728,
                      (ulong)pSVar39->rejitReasonCounts[(long)pLVar26]);
      }
      uVar37 = uVar37 + uVar32;
      pLVar26 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                 *)((long)&(pLVar26->
                           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                           )._vptr_ReadOnlyList + 1);
    } while (local_48 != pLVar26);
    Output::Print(L"%-40s %6d\n",L"TOTAL,",(ulong)uVar37);
    Output::Print(L"\n\n");
    pSVar39 = local_38;
    if ((DAT_015bc46a != 0) && (local_38->rejitStatsMap != (RejitStatsMap *)0x0)) {
      Output::Print(L"%-30s %14s %14s\n",L"Function (#),",L"Bailout Count,");
      pRVar35 = local_38->rejitStatsMap;
      iVar38 = pRVar35->size;
      pSVar39 = local_38;
      if (0 < iVar38) {
        pPVar36 = (Phases *)0x0;
        local_40 = pRVar35;
        do {
          iVar46 = (pRVar35->buckets).ptr[(long)pPVar36];
          if (iVar46 != -1) {
            iVar38 = -1;
            local_58 = pPVar36;
            do {
              pWVar8 = (pRVar35->entries).ptr;
              pPVar9 = (ParseableFunctionInfo *)
                       ((pWVar8[iVar46].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
              if (pPVar9 == (ParseableFunctionInfo *)0x0) {
                iVar2 = pWVar8[iVar46].next;
                JsUtil::
                WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
                ::RemoveEntry(pRVar35,iVar46,iVar38,(uint)local_58);
              }
              else {
                pRVar10 = pWVar8[iVar46].value.ptr;
                if (local_48 !=
                    (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                     *)0x0) {
                  uVar32 = pRVar10->m_totalRejits;
                  pLVar26 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                             *)0x0;
                  do {
                    uVar32 = uVar32 + pRVar10->m_rejitReasonCounts[(long)pLVar26];
                    pRVar10->m_totalRejits = uVar32;
                    pLVar26 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                               *)((long)&(pLVar26->
                                         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                                         )._vptr_ReadOnlyList + 1);
                  } while (local_48 != pLVar26);
                }
                pBVar6 = pRVar10->m_bailoutReasonCounts;
                uVar37 = pBVar6->bucketCount;
                if ((ulong)uVar37 != 0) {
                  piVar11 = pBVar6->buckets;
                  pSVar7 = pBVar6->entries;
                  uVar42 = 0;
                  do {
                    if (piVar11[uVar42] != -1) {
                      uVar32 = pRVar10->m_totalBailouts;
                      iVar38 = piVar11[uVar42];
                      do {
                        iVar2 = pSVar7[iVar38].
                                super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
                        uVar32 = uVar32 + pSVar7[iVar38].
                                          super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                          .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                          super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                          .
                                          super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>
                                          .value;
                        pRVar10->m_totalBailouts = uVar32;
                        iVar38 = iVar2;
                      } while (iVar2 != -1);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != uVar37);
                }
                pcVar29 = ParseableFunctionInfo::GetExternalDisplayName(pPVar9);
                pcVar30 = FunctionProxy::GetDebugNumberSet
                                    ((FunctionProxy *)pPVar9,(wchar (*) [42])auStack_528);
                swprintf_s<256ul>((WCHAR (*) [256])auStack_328,L"%s (%s),",pcVar29,pcVar30);
                Output::Print(L"%-30s %14d, %14d\n",(WCHAR (*) [256])auStack_328,
                              (ulong)pRVar10->m_totalBailouts,(ulong)pRVar10->m_totalRejits);
                iVar2 = pWVar8[iVar46].next;
                iVar38 = iVar46;
              }
              iVar46 = iVar2;
              pRVar35 = local_40;
            } while (iVar46 != -1);
            iVar38 = local_40->size;
            pPVar36 = local_58;
            pSVar39 = local_38;
          }
          pPVar36 = (Phases *)&pPVar36->phaseList[0].field_0x1;
        } while ((long)pPVar36 < (long)iVar38);
      }
      Output::Print(L"\n\n");
      pRVar35 = pSVar39->rejitStatsMap;
      iVar38 = pRVar35->size;
      pSVar39 = local_38;
      if (0 < iVar38) {
        lVar47 = 0;
        _oneInterpretedFunctions = pRVar35;
        do {
          iVar46 = (pRVar35->buckets).ptr[lVar47];
          if (iVar46 != -1) {
            iVar38 = -1;
            do {
              pWVar8 = (pRVar35->entries).ptr + iVar46;
              pPVar9 = (ParseableFunctionInfo *)
                       (((pWVar8->key).ptr)->super_RecyclerWeakReferenceBase).strongRef;
              if (pPVar9 == (ParseableFunctionInfo *)0x0) {
                iVar2 = pWVar8->next;
                JsUtil::
                WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
                ::RemoveEntry(pRVar35,iVar46,iVar38,(uint)lVar47);
                iVar46 = iVar2;
              }
              else {
                local_58 = (Phases *)CONCAT44(local_58._4_4_,iVar46);
                pRVar35 = (RejitStatsMap *)(pWVar8->value).ptr;
                pct = (double)pWVar8;
                pcVar29 = ParseableFunctionInfo::GetExternalDisplayName(pPVar9);
                pcVar30 = FunctionProxy::GetDebugNumberSet
                                    ((FunctionProxy *)pPVar9,(wchar (*) [42])(rejits + 0xe));
                swprintf_s<256ul>((WCHAR (*) [256])auStack_528,L"%s (%s),",pcVar29,pcVar30);
                Output::Print(L"%-30s\n\n",(WCHAR (*) [256])auStack_528);
                if (*(int *)((long)&(pRVar35->entries).ptr + 4) != 0) {
                  Output::Print(L"%10sBailouts:\n",L"");
                  plVar5 = (long *)(pRVar35->buckets).ptr;
                  uVar37 = *(uint *)((long)plVar5 + 0x1c);
                  if (uVar37 != 0) {
                    uVar42 = 0;
                    local_40 = pRVar35;
                    do {
                      iVar38 = *(int *)(*plVar5 + uVar42 * 4);
                      if (iVar38 != -1) {
                        do {
                          lVar34 = plVar5[1];
                          lVar33 = (long)iVar38;
                          uVar37 = *(uint *)(lVar34 + lVar33 * 0xc);
                          iVar38 = *(int *)(lVar34 + 4 + lVar33 * 0xc);
                          if (uVar37 != 0) {
                            pcVar28 = GetBailOutKindName(*(BailOutKind *)(lVar34 + lVar33 * 0xc + 8)
                                                        );
                            swprintf_s<256ul>((WCHAR (*) [256])auStack_328,L"%S,",pcVar28);
                            Output::Print(L"%10s%-40s %6d\n",L"",(WCHAR (*) [256])auStack_328,
                                          (ulong)uVar37);
                          }
                        } while (iVar38 != -1);
                        uVar37 = *(uint *)((long)plVar5 + 0x1c);
                        pRVar35 = local_40;
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 < uVar37);
                  }
                }
                Output::Print(L"\n");
                pLVar26 = local_48;
                if (*(int *)&(pRVar35->entries).ptr != 0) {
                  Output::Print(L"%10sRejits:\n",L"");
                  if (pLVar26 !=
                      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                       *)0x0) {
                    pLVar40 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                               *)0x0;
                    do {
                      if (*(int *)(*(long *)pRVar35 + (long)pLVar40 * 4) != 0) {
                        swprintf_s<256ul>((WCHAR (*) [256])auStack_528,L"%S,",
                                          RejitReasonNames[(long)pLVar40]);
                        Output::Print(L"%10s%-40s %6d\n",L"",(WCHAR (*) [256])auStack_528,
                                      (ulong)*(uint *)(*(long *)pRVar35 + (long)pLVar40 * 4));
                      }
                      pLVar40 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                                 *)((long)&(pLVar40->
                                           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                                           )._vptr_ReadOnlyList + 1);
                    } while (pLVar26 != pLVar40);
                  }
                  Output::Print(L"\n\n");
                }
                pRVar35 = _oneInterpretedFunctions;
                iVar46 = *(int *)((long)pct + 4);
                iVar38 = (int)local_58;
              }
            } while (iVar46 != -1);
            iVar38 = pRVar35->size;
          }
          lVar47 = lVar47 + 1;
          pSVar39 = local_38;
        } while (lVar47 < iVar38);
      }
    }
  }
  ClearBailoutReasonCountsMap(pSVar39);
  ClearRejitReasonCountsArray(pSVar39);
  bVar25 = Phases::IsEnabled((Phases *)&DAT_015b3868,ObjTypeSpecPhase);
  if (bVar25) {
    totalBuckets[10] = 0;
    totalBuckets[0xb] = 0;
    totalBuckets[0xc] = 0;
    totalBuckets[6] = 0;
    totalBuckets[7] = 0;
    totalBuckets[8] = 0;
    totalBuckets[9] = 0;
    totalBuckets[2] = 0;
    totalBuckets[3] = 0;
    totalBuckets[4] = 0;
    totalBuckets[5] = 0;
    auStack_528 = (undefined1  [8])0x0;
    totalBuckets[0] = 0;
    totalBuckets[1] = 0;
    pct = (double)pSVar39->fieldAccessStatsByFunctionNumber;
    if (((FieldAccessStatsByFunctionNumberMap *)pct != (FieldAccessStatsByFunctionNumberMap *)0x0)
       && (uVar37 = ((FieldAccessStatsByFunctionNumberMap *)pct)->bucketCount, uVar37 != 0)) {
      puVar27 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      addr = rejits + 0xe;
      _oneInterpretedFunctions = (RejitStatsMap *)&DAT_015b3868;
      uVar42 = 0;
LAB_0078807c:
      iVar38 = *(int *)(*(long *)pct + uVar42 * 4);
      uVar23 = buf_1._48_8_;
      if (iVar38 != -1) {
LAB_00788093:
        lVar47 = *(long *)((long)pct + 8);
        lVar34 = (long)iVar38 * 0x10;
        local_40 = (RejitStatsMap *)CONCAT44(local_40._4_4_,*(undefined4 *)(lVar47 + 8 + lVar34));
        local_58 = *(Phases **)(lVar47 + lVar34);
        local_48 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                    *)CONCAT44(local_48._4_4_,*(undefined4 *)(lVar47 + 0xc + lVar34));
        buf_1[0x14] = L'\0';
        buf_1[0x15] = L'\0';
        buf_1[0x16] = L'\0';
        buf_1[0x17] = L'\0';
        buf_1[0x18] = L'\0';
        buf_1[0x19] = L'\0';
        buf_1[0xc] = L'\0';
        buf_1[0xd] = L'\0';
        buf_1[0xe] = L'\0';
        buf_1[0xf] = L'\0';
        buf_1[0x10] = L'\0';
        buf_1[0x11] = L'\0';
        buf_1[0x12] = L'\0';
        buf_1[0x13] = L'\0';
        buf_1[4] = L'\0';
        buf_1[5] = L'\0';
        buf_1[6] = L'\0';
        buf_1[7] = L'\0';
        buf_1[8] = L'\0';
        buf_1[9] = L'\0';
        buf_1[10] = L'\0';
        buf_1[0xb] = L'\0';
        auStack_328 = (undefined1  [8])0x0;
        buf_1[0] = L'\0';
        buf_1[1] = L'\0';
        buf_1[2] = L'\0';
        buf_1[3] = L'\0';
        auStack_728 = (undefined1  [8])&local_58->phaseList[0].range;
        nativeCodeBuckets._0_8_ = auStack_728;
        do {
          if (nativeCodeBuckets._0_8_ == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar27 = 1;
            bVar25 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                         ,0x76,"(current != nullptr)","current != nullptr");
            uVar22._4_2_ = buf_1[0x1a];
            uVar22._6_2_ = buf_1[0x1b];
            uVar22._0_2_ = buf_1[0x18];
            uVar22._2_2_ = buf_1[0x19];
            uVar21._4_2_ = buf_1[0x16];
            uVar21._6_2_ = buf_1[0x17];
            uVar21._0_2_ = buf_1[0x14];
            uVar21._2_2_ = buf_1[0x15];
            uVar20._4_2_ = buf_1[0x12];
            uVar20._6_2_ = buf_1[0x13];
            uVar20._0_2_ = buf_1[0x10];
            uVar20._2_2_ = buf_1[0x11];
            if (!bVar25) {
LAB_007887ab:
              pcVar16 = (code *)invalidInstructionException();
              buf_1._32_8_ = uVar20;
              buf_1._40_8_ = uVar21;
              buf_1._48_8_ = uVar22;
              (*pcVar16)();
            }
            *puVar27 = 0;
          }
          auVar24 = auStack_728;
          pSVar12 = *(SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> **)
                     nativeCodeBuckets._0_8_;
          Memory::Recycler::WBSetBit((char *)addr);
          unique0x10002d1d = pSVar12;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          if ((undefined1  [8])stack0xffffffffffffff18 == auVar24) goto LAB_007881b7;
          pSVar12 = *(SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> **)
                     nativeCodeBuckets._0_8_;
          Memory::Recycler::WBSetBit((char *)addr);
          unique0x10002d25 = pSVar12;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          nativeCodeBuckets._0_8_ = stack0xffffffffffffff18;
          pTVar31 = SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>::Iterator::Data
                              ((Iterator *)auStack_728);
          FieldAccessStats::Add((FieldAccessStats *)auStack_328,pTVar31->ptr);
        } while( true );
      }
      goto LAB_007882d9;
    }
LAB_007882e8:
    Output::Print(L"FieldAccessStats: totals\n");
    Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)auStack_528 & 0xffffffff,
                  (ulong)auStack_528 >> 0x20);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",totalBuckets._0_8_ & 0xffffffff,
                  (ulong)totalBuckets._0_8_ >> 0x20,totalBuckets._44_8_ & 0xffffffff);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,totalBuckets._8_8_ & 0xffffffff,totalBuckets._24_8_ & 0xffffffff,
                  (ulong)totalBuckets._24_8_ >> 0x20,(ulong)totalBuckets._8_8_ >> 0x20,
                  totalBuckets._16_8_ & 0xffffffff,(ulong)totalBuckets._16_8_ >> 0x20,
                  (ulong)totalBuckets[10],(ulong)totalBuckets[8],(ulong)totalBuckets[9],
                  (ulong)totalBuckets._44_8_ >> 0x20);
    pSVar39 = local_38;
  }
  bVar25 = Phases::IsEnabled((Phases *)&DAT_015b3868,MissingPropertyCachePhase);
  if (bVar25) {
    Output::Print(L"MissingPropertyStats: hits = %d, misses = %d, cache attempts = %d.\n",
                  (ulong)(uint)pSVar39->missingPropertyHits,
                  (ulong)(uint)pSVar39->missingPropertyMisses,
                  (ulong)(uint)pSVar39->missingPropertyCacheAttempts);
  }
  bVar25 = Phases::IsEnabled((Phases *)&DAT_015b3868,PolymorphicInlineCachePhase);
  if (bVar25) {
    Output::Print(L"%s,%s,%s,%s,%s,%s,%s,%s,%s\n",L"Function",L"Property",L"Kind",L"Accesses",
                  L"Misses",L"Miss Rate",L"Collisions",L"Collision Rate",L"Slot Count");
    pCVar13 = local_38->cacheDataMap;
    uVar37 = pCVar13->bucketCount;
    if (uVar37 != 0) {
      uVar42 = 0;
      do {
        iVar38 = (pCVar13->buckets).ptr[uVar42];
        if (iVar38 != -1) {
          do {
            pSVar14 = (pCVar13->entries).ptr;
            iVar46 = pSVar14[iVar38].
                     super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .
                     super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                     .
                     super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                     .
                     super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                     .next;
            pPVar15 = pSVar14[iVar38].
                      super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      .
                      super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                      .
                      super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                      .
                      super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                      .key.ptr;
            (*(pPVar15->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])
                      (pPVar15,pSVar14[iVar38].
                               super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                               .
                               super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                               .
                               super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                               .
                               super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                               .value.ptr);
            iVar38 = iVar46;
          } while (iVar46 != -1);
          uVar37 = pCVar13->bucketCount;
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < uVar37);
    }
  }
  pSVar39 = local_38;
  this_00 = local_38->regexStatsDatabase;
  if (this_00 != (RegexStatsDatabase *)0x0) {
    w = GetRegexDebugWriter(local_38);
    UnifiedRegex::RegexStatsDatabase::Print(this_00,w);
  }
  Output::TraceStats(EmitterPhase,L"Script Context: 0x%p Url: %s\n",pSVar39,pSVar39->url);
  Output::TraceStats(EmitterPhase,L"  Total thread committed code size = %d\n",
                     pSVar39->threadContext->nativeCodeSize);
  Output::TraceStats(ParsePhase,L"Script Context: 0x%p Url: %s\n",pSVar39,pSVar39->url);
  Output::TraceStats(ParsePhase,L"  Total ThreadContext source size %d\n",
                     pSVar39->threadContext->sourceCodeSize);
  Output::Flush();
  return;
LAB_007881b7:
  bVar25 = Phases::IsEnabled((Phases *)_oneInterpretedFunctions,ObjTypeSpecPhase);
  if ((bVar25) && (DAT_015bc46a == 1)) {
    plVar5 = (long *)**(long **)local_58->phaseList;
    pcVar41 = L"<unknown>";
    if (plVar5 != (long *)0x0) {
      pcVar41 = (char16_t *)(**(code **)(*plVar5 + 0x38))(plVar5,L"<unknown>");
    }
    Output::Print(L"FieldAccessStats: function %s (#%u): inline cache stats:\n",pcVar41,
                  (ulong)local_48 & 0xffffffff);
    Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)auStack_328 & 0xffffffff,
                  (ulong)auStack_328 >> 0x20);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",buf_1._0_8_ & 0xffffffff,
                  (ulong)buf_1._0_8_ >> 0x20,(ulong)(uint)buf_1._44_4_);
    local_48 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                *)((ulong)buf_1._16_8_ >> 0x20);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,buf_1._8_8_ & 0xffffffff,buf_1._24_8_ & 0xffffffff,(ulong)buf_1._24_8_ >> 0x20,
                  (ulong)buf_1._8_8_ >> 0x20,buf_1._16_8_ & 0xffffffff,local_48,
                  (ulong)(uint)buf_1._40_4_,(ulong)(uint)buf_1._32_4_,(ulong)(uint)buf_1._36_4_,
                  (ulong)(uint)buf_1._48_4_);
  }
  FieldAccessStats::Add((FieldAccessStats *)auStack_528,(FieldAccessStats *)auStack_328);
  uVar23._4_2_ = buf_1[0x1a];
  uVar23._6_2_ = buf_1[0x1b];
  uVar23._0_2_ = buf_1[0x18];
  uVar23._2_2_ = buf_1[0x19];
  iVar38 = (int)local_40;
  if ((int)local_40 == -1) goto code_r0x007882cd;
  goto LAB_00788093;
code_r0x007882cd:
  uVar37 = *(uint *)((long)pct + 0x1c);
LAB_007882d9:
  buf_1._48_8_ = uVar23;
  uVar42 = uVar42 + 1;
  if (uVar37 <= uVar42) goto LAB_007882e8;
  goto LAB_0078807c;
}

Assistant:

void ScriptContext::PrintStats()
    {

#ifdef PROFILE_TYPES
        if (Configuration::Global.flags.ProfileTypes)
        {
            ProfileTypes();
        }
#endif

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        if (Configuration::Global.flags.ProfileBailOutRecordMemory)
        {
            Output::Print(_u("CodeSize: %6d\nBailOutRecord Size: %6d\nLocalOffsets Size: %6d\n"), codeSize, bailOutRecordBytes, bailOutOffsetBytes);
        }
#endif

#ifdef PROFILE_OBJECT_LITERALS
        if (Configuration::Global.flags.ProfileObjectLiteral)
        {
            ProfileObjectLiteral();
        }
#endif

#ifdef PROFILE_STRINGS
        if (stringProfiler != nullptr)
        {
            stringProfiler->PrintAll();
            Adelete(MiscAllocator(), stringProfiler);
            stringProfiler = nullptr;
        }
#endif

#ifdef PROFILE_MEM
        if (profileMemoryDump && MemoryProfiler::IsTraceEnabled())
        {
            MemoryProfiler::PrintAll();
#ifdef PROFILE_RECYCLER_ALLOC
            if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::AllPhase)
                || Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::RunPhase))
            {
                GetRecycler()->PrintAllocStats();
            }
#endif
        }
#endif
#if DBG_DUMP
        if (PHASE_STATS1(Js::ByteCodePhase))
        {
            Output::Print(_u(" Total Bytecode size: <%d, %d, %d> = %d\n"),
                byteCodeDataSize,
                byteCodeAuxiliaryDataSize,
                byteCodeAuxiliaryContextDataSize,
                byteCodeDataSize + byteCodeAuxiliaryDataSize + byteCodeAuxiliaryContextDataSize);
        }

        if (Configuration::Global.flags.BytecodeHist)
        {
            Output::Print(_u("ByteCode Histogram\n"));
            Output::Print(_u("\n"));

            uint total = 0;
            uint unique = 0;
            for (int j = 0; j < (int)OpCode::ByteCodeLast; j++)
            {
                total += byteCodeHistogram[j];
                if (byteCodeHistogram[j] > 0)
                {
                    unique++;
                }
            }
            Output::Print(_u("%9u                     Total executed ops\n"), total);
            Output::Print(_u("\n"));

            uint max = UINT_MAX;
            double pctcume = 0.0;

            while (true)
            {
                uint upper = 0;
                int index = -1;
                for (int j = 0; j < (int)OpCode::ByteCodeLast; j++)
                {
                    if (OpCodeUtil::IsValidOpcode((OpCode)j) && byteCodeHistogram[j] > upper && byteCodeHistogram[j] < max)
                    {
                        index = j;
                        upper = byteCodeHistogram[j];
                    }
                }

                if (index == -1)
                {
                    break;
                }

                max = byteCodeHistogram[index];

                for (OpCode j = (OpCode)0; j < OpCode::ByteCodeLast; j++)
                {
                    if (OpCodeUtil::IsValidOpcode(j) && max == byteCodeHistogram[(int)j])
                    {
                        double pct = ((double)max) / total;
                        pctcume += pct;

                        Output::Print(_u("%9u  %5.1lf  %5.1lf  %04x %s\n"), max, pct * 100, pctcume * 100, j, OpCodeUtil::GetOpCodeName(j));
                    }
                }
            }
            Output::Print(_u("\n"));
            Output::Print(_u("Unique opcodes: %d\n"), unique);
        }

#endif

#if ENABLE_NATIVE_CODEGEN
#ifdef BGJIT_STATS
        // We do not care about small script contexts without much activity - unless t
        if (PHASE_STATS1(Js::BGJitPhase) && (this->interpretedCount > 50 || Js::Configuration::Global.flags.IsEnabled(Js::ForceFlag)))
        {

#define MAX_BUCKETS 15
            uint loopJitCodeUsed = 0;
            uint bucketSize1 = 20;
            uint bucketSize2 = 100;
            uint size1CutOffbucketId = 4;
            uint totalBuckets[MAX_BUCKETS] = { 0 };
            uint nativeCodeBuckets[MAX_BUCKETS] = { 0 };
            uint usedNativeCodeBuckets[MAX_BUCKETS] = { 0 };
            uint rejits[MAX_BUCKETS] = { 0 };
            uint zeroInterpretedFunctions = 0;
            uint oneInterpretedFunctions = 0;
            uint nonZeroBytecodeFunctions = 0;
            Output::Print(_u("Script Context: 0x%p Url: %s\n"), this, this->url);

            FunctionBody* anyFunctionBody = this->FindFunction([](FunctionBody* body) { return body != nullptr; });

            if (anyFunctionBody)
            {
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("Function list\n"));
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("===============================\n"));
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-24s, %-8s, %-10s, %-10s, %-10s, %-10s, %-10s\n"), _u("Function"), _u("InterpretedCount"), _u("ByteCodeInLoopSize"), _u("ByteCodeSize"), _u("IsJitted"), _u("IsUsed"), _u("NativeCodeSize"));

                this->MapFunction([&](FunctionBody* body)
                {
                    bool isNativeCode = false;

                    // Filtering interpreted count lowers a lot of noise
                    if (body->GetInterpretedCount() > 1 || Js::Configuration::Global.flags.IsEnabled(Js::ForceFlag))
                    {
                        body->MapEntryPoints([&](uint entryPointIndex, FunctionEntryPointInfo* entryPoint)
                        {
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                            char rejit = entryPointIndex > 0 ? '*' : ' ';
                            isNativeCode = entryPoint->IsNativeCode() | isNativeCode;
                            OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"),
                                body->GetExternalDisplayName(),
                                body->GetDebugNumberSet(debugStringBuffer),
                                rejit,
                                body->GetInterpretedCount(),
                                body->GetByteCodeInLoopCount(),
                                body->GetByteCodeCount(),
                                entryPoint->IsNativeCode() ? _u("Jitted") : _u("Interpreted"),
                                body->GetNativeEntryPointUsed() ? _u("Used") : _u("NotUsed"),
                                entryPoint->IsNativeCode() ? entryPoint->GetCodeSize() : 0);
                        });
                    }
                    if (body->GetInterpretedCount() == 0)
                    {
                        zeroInterpretedFunctions++;
                        if (body->GetByteCodeCount() > 0)
                        {
                            nonZeroBytecodeFunctions++;
                        }
                    }
                    else if (body->GetInterpretedCount() == 1)
                    {
                        oneInterpretedFunctions++;
                    }


                    // Generate a histogram using interpreted counts.
                    uint bucket;
                    uint intrpCount = body->GetInterpretedCount();
                    if (intrpCount < 100)
                    {
                        bucket = intrpCount / bucketSize1;
                    }
                    else if (intrpCount < 1000)
                    {
                        bucket = size1CutOffbucketId  + intrpCount / bucketSize2;
                    }
                    else
                    {
                        bucket = MAX_BUCKETS - 1;
                    }

                    // Explicitly assume that the bucket count is less than the following counts (which are all equal)
                    // This is because min will return MAX_BUCKETS - 1 if the count exceeds MAX_BUCKETS - 1.
                    __analysis_assume(bucket < MAX_BUCKETS);

                    totalBuckets[bucket]++;
                    if (isNativeCode)
                    {
                        nativeCodeBuckets[bucket]++;
                        if (body->GetNativeEntryPointUsed())
                        {
                            usedNativeCodeBuckets[bucket]++;
                        }
                        if (body->HasRejit())
                        {
                            rejits[bucket]++;
                        }
                    }

                    body->MapLoopHeaders([&](uint loopNumber, LoopHeader* header)
                    {
                        char16 loopBodyName[256];
                        body->GetLoopBodyName(loopNumber, loopBodyName, _countof(loopBodyName));
                        header->MapEntryPoints([&](int index, LoopEntryPointInfo * entryPoint)
                        {
                            if (entryPoint->IsNativeCode())
                            {
                                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                                char rejit = index > 0 ? '*' : ' ';
                                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"),
                                    loopBodyName,
                                    body->GetDebugNumberSet(debugStringBuffer),
                                    rejit,
                                    header->interpretCount,
                                    header->GetByteCodeCount(),
                                    header->GetByteCodeCount(),
                                    _u("Jitted"),
                                    entryPoint->IsUsed() ? _u("Used") : _u("NotUsed"),
                                    entryPoint->GetCodeSize());
                                if (entryPoint->IsUsed())
                                {
                                    loopJitCodeUsed++;
                                }
                            }
                        });
                    });
                });
            }

            Output::Print(_u("**  SpeculativelyJitted: %6d FunctionsJitted: %6d JittedUsed: %6d Usage:%f ByteCodesJitted: %6d JitCodeUsed: %6d Usage: %f \n"),
                speculativeJitCount, funcJITCount, funcJitCodeUsed, ((float)(funcJitCodeUsed) / funcJITCount) * 100, bytecodeJITCount, jitCodeUsed, ((float)(jitCodeUsed) / bytecodeJITCount) * 100);
            Output::Print(_u("** LoopJITCount: %6d LoopJitCodeUsed: %6d Usage: %f\n"),
                loopJITCount, loopJitCodeUsed, ((float)loopJitCodeUsed / loopJITCount) * 100);
            Output::Print(_u("** TotalInterpretedCalls: %6d MaxFuncInterp: %6d  InterpretedHighPri: %6d \n"),
                interpretedCount, maxFuncInterpret, interpretedCallsHighPri);
            Output::Print(_u("** ZeroInterpretedFunctions: %6d OneInterpretedFunctions: %6d ZeroInterpretedWithNonZeroBytecode: %6d \n "), zeroInterpretedFunctions, oneInterpretedFunctions, nonZeroBytecodeFunctions);
            Output::Print(_u("** %-24s : %-10s %-10s %-10s %-10s %-10s\n"), _u("InterpretedCounts"), _u("Total"), _u("NativeCode"), _u("Used"), _u("Usage"), _u("Rejits"));
            uint low = 0;
            uint high = 0;
            for (uint i = 0; i < _countof(totalBuckets); i++)
            {
                low = high;
                if (i <= size1CutOffbucketId)
                {
                    high = low + bucketSize1;
                }
                else if (i < (_countof(totalBuckets) - 1))
                {
                    high = low + bucketSize2;               }
                else
                {
                    high = 100000;
                }
                Output::Print(_u("** %10d - %10d : %10d %10d %10d %7.2f %10d\n"), low, high, totalBuckets[i], nativeCodeBuckets[i], usedNativeCodeBuckets[i], ((float)usedNativeCodeBuckets[i] / nativeCodeBuckets[i]) * 100, rejits[i]);
            }
            Output::Print(_u("\n\n"));
        }
#undef MAX_BUCKETS
#endif

#ifdef REJIT_STATS
        if (PHASE_STATS1(Js::ReJITPhase))
        {
            uint totalBailouts = 0;
            uint totalRejits = 0;
            WCHAR buf[256];

            // Dump bailout data.
            Output::Print(_u("%-40s %6s\n"), _u("Bailout Reason,"), _u("Count"));

            bailoutReasonCounts->Map([&totalBailouts](uint kind, uint val) {
                WCHAR buf[256];
                totalBailouts += val;
                if (val != 0)
                {
                    swprintf_s(buf, _u("%S,"), GetBailOutKindName((IR::BailOutKind)kind));
                    Output::Print(_u("%-40s %6d\n"), buf, val);
                }
            });


            Output::Print(_u("%-40s %6d\n"), _u("TOTAL,"), totalBailouts);
            Output::Print(_u("\n\n"));

            // Dump rejit data.
            Output::Print(_u("%-40s %6s\n"), _u("Rejit Reason,"), _u("Count"));
            for (uint i = 0; i < NumRejitReasons; ++i)
            {
                totalRejits += rejitReasonCounts[i];
                if (rejitReasonCounts[i] != 0)
                {
                    swprintf_s(buf, _u("%S,"), RejitReasonNames[i]);
                    Output::Print(_u("%-40s %6d\n"), buf, rejitReasonCounts[i]);
                }
            }
            Output::Print(_u("%-40s %6d\n"), _u("TOTAL,"), totalRejits);
            Output::Print(_u("\n\n"));

            // If in verbose mode, dump data for each FunctionBody
            if (CONFIG_FLAG(Verbose) && rejitStatsMap != nullptr)
            {
                // Aggregated data
                Output::Print(_u("%-30s %14s %14s\n"), _u("Function (#),"), _u("Bailout Count,"), _u("Rejit Count"));
                rejitStatsMap->Map([](Js::FunctionBody const *body, RejitStats *stats, RecyclerWeakReference<const Js::FunctionBody> const*) {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    for (uint i = 0; i < NumRejitReasons; ++i)
                        stats->m_totalRejits += stats->m_rejitReasonCounts[i];

                    stats->m_bailoutReasonCounts->Map([stats](uint kind, uint val) {
                        stats->m_totalBailouts += val;
                    });

                    WCHAR buf[256];

                    swprintf_s(buf, _u("%s (%s),"), body->GetExternalDisplayName(), (const_cast<Js::FunctionBody*>(body))->GetDebugNumberSet(debugStringBuffer)); //TODO Kount
                    Output::Print(_u("%-30s %14d, %14d\n"), buf, stats->m_totalBailouts, stats->m_totalRejits);

                });
                Output::Print(_u("\n\n"));

                // Per FunctionBody data
                rejitStatsMap->Map([](Js::FunctionBody const *body, RejitStats *stats, RecyclerWeakReference<const Js::FunctionBody> const *) {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    WCHAR buf[256];

                    swprintf_s(buf, _u("%s (%s),"), body->GetExternalDisplayName(), (const_cast<Js::FunctionBody*>(body))->GetDebugNumberSet(debugStringBuffer)); //TODO Kount
                    Output::Print(_u("%-30s\n\n"), buf);

                    // Dump bailout data
                    if (stats->m_totalBailouts != 0)
                    {
                        Output::Print(_u("%10sBailouts:\n"), _u(""));

                        stats->m_bailoutReasonCounts->Map([](uint kind, uint val) {
                            if (val != 0)
                            {
                                WCHAR buf[256];
                                swprintf_s(buf, _u("%S,"), GetBailOutKindName((IR::BailOutKind)kind));
                                Output::Print(_u("%10s%-40s %6d\n"), _u(""), buf, val);
                            }
                        });
                    }
                    Output::Print(_u("\n"));

                    // Dump rejit data.
                    if (stats->m_totalRejits != 0)
                    {
                        Output::Print(_u("%10sRejits:\n"), _u(""));
                        for (uint i = 0; i < NumRejitReasons; ++i)
                        {
                            if (stats->m_rejitReasonCounts[i] != 0)
                            {
                                swprintf_s(buf, _u("%S,"), RejitReasonNames[i]);
                                Output::Print(_u("%10s%-40s %6d\n"), _u(""), buf, stats->m_rejitReasonCounts[i]);
                            }
                        }
                        Output::Print(_u("\n\n"));
                    }
                });

            }
        }

        this->ClearBailoutReasonCountsMap();
        this->ClearRejitReasonCountsArray();
#endif

#ifdef FIELD_ACCESS_STATS
    if (PHASE_STATS1(Js::ObjTypeSpecPhase))
    {
        FieldAccessStats globalStats;
        if (this->fieldAccessStatsByFunctionNumber != nullptr)
        {
            this->fieldAccessStatsByFunctionNumber->Map([&globalStats](uint functionNumber, FieldAccessStatsEntry* entry)
            {
                FieldAccessStats functionStats;
                entry->stats.Map([&functionStats](FieldAccessStatsPtr entryPointStats)
                {
                    functionStats.Add(entryPointStats);
                });

                if (PHASE_VERBOSE_STATS1(Js::ObjTypeSpecPhase))
                {
                    FunctionBody* functionBody = entry->functionBodyWeakRef->Get();
                    const char16* functionName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                    Output::Print(_u("FieldAccessStats: function %s (#%u): inline cache stats:\n"), functionName, functionNumber);
                    Output::Print(_u("    overall: total %u, no profile info %u\n"), functionStats.totalInlineCacheCount, functionStats.noInfoInlineCacheCount);
                    Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                        functionStats.monoInlineCacheCount, functionStats.emptyMonoInlineCacheCount, functionStats.clonedMonoInlineCacheCount);
                    Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                        functionStats.polyInlineCacheCount, functionStats.highUtilPolyInlineCacheCount, functionStats.lowUtilPolyInlineCacheCount,
                        functionStats.nullPolyInlineCacheCount, functionStats.emptyPolyInlineCacheCount, functionStats.ignoredPolyInlineCacheCount, functionStats.disabledPolyInlineCacheCount,
                        functionStats.equivPolyInlineCacheCount, functionStats.nonEquivPolyInlineCacheCount, functionStats.clonedPolyInlineCacheCount);
                }

                globalStats.Add(&functionStats);
            });
        }

        Output::Print(_u("FieldAccessStats: totals\n"));
        Output::Print(_u("    overall: total %u, no profile info %u\n"), globalStats.totalInlineCacheCount, globalStats.noInfoInlineCacheCount);
        Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
            globalStats.monoInlineCacheCount, globalStats.emptyMonoInlineCacheCount, globalStats.clonedMonoInlineCacheCount);
        Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
            globalStats.polyInlineCacheCount, globalStats.highUtilPolyInlineCacheCount, globalStats.lowUtilPolyInlineCacheCount,
            globalStats.nullPolyInlineCacheCount, globalStats.emptyPolyInlineCacheCount, globalStats.ignoredPolyInlineCacheCount, globalStats.disabledPolyInlineCacheCount,
            globalStats.equivPolyInlineCacheCount, globalStats.nonEquivPolyInlineCacheCount, globalStats.clonedPolyInlineCacheCount);
    }
#endif

#ifdef MISSING_PROPERTY_STATS
    if (PHASE_STATS1(Js::MissingPropertyCachePhase))
    {
        Output::Print(_u("MissingPropertyStats: hits = %d, misses = %d, cache attempts = %d.\n"),
            this->missingPropertyHits, this->missingPropertyMisses, this->missingPropertyCacheAttempts);
    }
#endif


#ifdef INLINE_CACHE_STATS
        if (PHASE_STATS1(Js::PolymorphicInlineCachePhase))
        {
            Output::Print(_u("%s,%s,%s,%s,%s,%s,%s,%s,%s\n"), _u("Function"), _u("Property"), _u("Kind"), _u("Accesses"), _u("Misses"), _u("Miss Rate"), _u("Collisions"), _u("Collision Rate"), _u("Slot Count"));
            cacheDataMap->Map([this](Js::PolymorphicInlineCache const *cache, InlineCacheData *data) {
                cache->PrintStats(data);
            });
        }
#endif

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (regexStatsDatabase != 0)
            regexStatsDatabase->Print(GetRegexDebugWriter());
#endif
        OUTPUT_STATS(Js::EmitterPhase, _u("Script Context: 0x%p Url: %s\n"), this, this->url);
        OUTPUT_STATS(Js::EmitterPhase, _u("  Total thread committed code size = %d\n"), this->GetThreadContext()->GetCodeSize());

        OUTPUT_STATS(Js::ParsePhase, _u("Script Context: 0x%p Url: %s\n"), this, this->url);
        OUTPUT_STATS(Js::ParsePhase, _u("  Total ThreadContext source size %d\n"), this->GetThreadContext()->GetSourceSize());
#endif

#ifdef ENABLE_BASIC_TELEMETRY
        if (this->telemetry != nullptr)
        {
            // If an exception (e.g. out-of-memory) happens during InitializeAllocations then `this->telemetry` will be null and the Close method will still be called, hence this guard expression.
            this->telemetry->OutputPrint();
        }
#endif

        Output::Flush();
    }